

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix-face.c
# Opt level: O3

int ndn_unix_face_down(ndn_face_intf *self)

{
  self->state = '\0';
  if (*(int *)&self[4].up != -1) {
    close(*(int *)&self[4].up);
    *(undefined4 *)&self[4].up = 0xffffffff;
  }
  if (*(ndn_msg **)&self[3].face_id != (ndn_msg *)0x0) {
    ndn_msgqueue_cancel(*(ndn_msg **)&self[3].face_id);
    self[3].face_id = 0;
    self[3].state = '\0';
    self[3].type = '\0';
    *(undefined4 *)&self[3].field_0x24 = 0;
  }
  return 0;
}

Assistant:

static int
ndn_unix_face_down(struct ndn_face_intf* self){
  ndn_unix_face_t* ptr = (ndn_unix_face_t*)self;
  self->state = NDN_FACE_STATE_DOWN;

  if(ptr->sock != -1){
    close(ptr->sock);
    ptr->sock = -1;
  }

  if(ptr->process_event != NULL){
    ndn_msgqueue_cancel(ptr->process_event);
    ptr->process_event = NULL;
  }

  return NDN_SUCCESS;
}